

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_geti(lua_State *L,int idx,lua_Integer n)

{
  TValue *key;
  int iVar1;
  undefined4 uVar2;
  TValue *t;
  TValue *slot;
  StkId pTVar3;
  
  t = index2addr(L,idx);
  if (t->tt_ == 0x45) {
    slot = luaH_getint((Table *)(t->value_).gc,n);
    if (slot->tt_ != 0) {
      pTVar3 = L->top;
      iVar1 = slot->tt_;
      uVar2 = *(undefined4 *)&slot->field_0xc;
      pTVar3->value_ = slot->value_;
      pTVar3->tt_ = iVar1;
      *(undefined4 *)&pTVar3->field_0xc = uVar2;
      pTVar3 = L->top + 1;
      L->top = pTVar3;
      goto LAB_00105477;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pTVar3 = L->top;
  (pTVar3->value_).i = n;
  pTVar3->tt_ = 0x13;
  key = L->top;
  L->top = key + 1;
  luaV_finishget(L,t,key,key,slot);
  pTVar3 = L->top;
LAB_00105477:
  return pTVar3[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_geti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  t = index2addr(L, idx);
  if (luaV_fastget(L, t, n, slot, luaH_getint)) {
    setobj2s(L, L->top, slot);
    api_incr_top(L);
  }
  else {
    setivalue(L->top, n);
    api_incr_top(L);
    luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}